

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O1

string * __thiscall
RigidBodyDynamics::Utils::print_hierarchy_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model,uint body_index,int indent)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  string *psVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  undefined4 in_register_0000000c;
  ulong uVar8;
  ulong uVar9;
  SpatialVector *extraout_RDX;
  SpatialVector *extraout_RDX_00;
  SpatialVector *extraout_RDX_01;
  SpatialVector *extraout_RDX_02;
  SpatialVector *extraout_RDX_03;
  SpatialVector *joint_dof;
  SpatialVector *extraout_RDX_04;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  stringstream result;
  string local_1f8;
  uint local_1d4;
  ulong local_1d0;
  int local_1c4;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  uVar8 = CONCAT44(in_register_0000000c,body_index);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1d0 = uVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  uVar11 = (uint)uVar8;
  if (0 < (int)local_1d0) {
    uVar9 = local_1d0 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      uVar11 = (uint)uVar8;
      uVar10 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
  get_body_name_abi_cxx11_(&local_1f8,this,(Model *)((ulong)model & 0xffffffff),uVar11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  joint_dof = extraout_RDX;
  local_1c0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    joint_dof = extraout_RDX_00;
  }
  if ((uint)model != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [ ",3);
    joint_dof = extraout_RDX_01;
  }
  uVar8 = (ulong)model & 0xffffffff;
  uVar11 = (uint)model;
  if (*(char *)(*(long *)(this + 0x308) + 0x68 + uVar8 * 0x70) == '\x01') {
    do {
      lVar7 = *(long *)(*(long *)(this + 0x30) + 8 + uVar8 * 0x18);
      lVar1 = *(long *)(*(long *)(this + 0x30) + uVar8 * 0x18);
      if (lVar7 == lVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," end",4);
        joint_dof = extraout_RDX_04;
        uVar11 = (uint)uVar8;
        break;
      }
      if (4 < (ulong)(lVar7 - lVar1)) {
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Error: Cannot determine multi-dof joint as massless body with id ",0x41);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (name: ",8);
        Model::GetBodyName_abi_cxx11_(&local_1f8,(Model *)this,(uint)uVar8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") has more than one child:",0x1a)
        ;
        std::endl<char,std::char_traits<char>>(poVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (*(long *)(*(long *)(this + 0x30) + 8 + uVar8 * 0x18) !=
            *(long *)(*(long *)(this + 0x30) + uVar8 * 0x18)) {
          uVar11 = 1;
          uVar9 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  id: ",6);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," name: ",7);
            Model::GetBodyName_abi_cxx11_
                      (&local_1f8,(Model *)this,
                       *(uint *)(*(long *)(*(long *)(this + 0x30) + uVar8 * 0x18) + uVar9 * 4));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar9 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar9 < (ulong)(*(long *)(*(long *)(this + 0x30) + 8 + uVar8 * 0x18) -
                                   *(long *)(*(long *)(this + 0x30) + uVar8 * 0x18) >> 2));
        }
        abort();
      }
      get_dof_name_abi_cxx11_(&local_1f8,(Utils *)(uVar8 * 0x30 + *(long *)(this + 0xb8)),joint_dof)
      ;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      joint_dof = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        joint_dof = extraout_RDX_03;
      }
      local_1d4 = **(uint **)(*(long *)(this + 0x30) + uVar8 * 0x18);
      uVar8 = (ulong)local_1d4;
      uVar11 = local_1d4;
    } while (*(char *)(*(long *)(this + 0x308) + 0x68 + uVar8 * 0x70) != '\0');
  }
  local_1d4 = uVar11;
  if (local_1d4 != 0) {
    get_dof_name_abi_cxx11_(&local_1f8,(Utils *)(uVar8 * 0x30 + *(long *)(this + 0xb8)),joint_dof);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ]",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  cVar3 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  lVar7 = *(long *)(this + 0x30);
  if (*(long *)(lVar7 + 8 + uVar8 * 0x18) != *(long *)(lVar7 + uVar8 * 0x18)) {
    plVar6 = (long *)(lVar7 + uVar8 * 0x18);
    iVar13 = (int)local_1d0;
    uVar9 = 0;
    uVar12 = 1;
    do {
      print_hierarchy_abi_cxx11_
                (&local_1f8,this,(Model *)(ulong)*(uint *)(*plVar6 + uVar9 * 4),iVar13 + 1,indent);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      plVar6 = (long *)(*(long *)(this + 0x30) + uVar8 * 0x18);
      bVar2 = uVar12 < (ulong)(plVar6[1] - *plVar6 >> 2);
      uVar9 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar2);
  }
  lVar7 = *(long *)(this + 0x2e8);
  if (*(long *)(this + 0x2f0) != lVar7) {
    local_1c4 = (int)local_1d0 + 1;
    uVar8 = 0;
    do {
      if (*(uint *)(lVar7 + 0x68 + uVar8 * 0x130) == local_1d4) {
        iVar13 = local_1c4;
        if (-1 < (int)local_1d0) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        Model::GetBodyName_abi_cxx11_(&local_1f8,(Model *)this,*(int *)(this + 0x300) + (int)uVar8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                            local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," [fixed]",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      lVar7 = *(long *)(this + 0x2e8);
      uVar9 = (*(long *)(this + 0x2f0) - lVar7 >> 4) * -0x79435e50d79435e5;
    } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
  }
  psVar4 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_hierarchy (const RigidBodyDynamics::Model &model, unsigned int body_index = 0, int indent = 0) {
	stringstream result ("");

	for (int j = 0; j < indent; j++)
		result << "  ";

	result << get_body_name (model, body_index);

	if (body_index > 0)
		result << " [ ";

	while (model.mBodies[body_index].mIsVirtual) {
		if (model.mu[body_index].size() == 0) {
			result << " end";
			break;
		} else if (model.mu[body_index].size() > 1) {
			cerr << endl << "Error: Cannot determine multi-dof joint as massless body with id " << body_index << " (name: " << model.GetBodyName(body_index) << ") has more than one child:" << endl;
			for (unsigned int ci = 0; ci < model.mu[body_index].size(); ci++) {
				cerr << "  id: " << model.mu[body_index][ci] << " name: " << model.GetBodyName(model.mu[body_index][ci]) << endl;
			}
			abort();
		}

		result << get_dof_name(model.S[body_index]) << ", ";

		body_index = model.mu[body_index][0];
	}

	if (body_index > 0)
		result << get_dof_name(model.S[body_index]) << " ]";
	result << endl;

	unsigned int child_index = 0;
	for (child_index = 0; child_index < model.mu[body_index].size(); child_index++) {
		result << print_hierarchy (model, model.mu[body_index][child_index], indent + 1);
	}

	// print fixed children
	for (unsigned int fbody_index = 0; fbody_index < model.mFixedBodies.size(); fbody_index++) {
		if (model.mFixedBodies[fbody_index].mMovableParent == body_index) {
			for (int j = 0; j < indent + 1; j++)
				result << "  ";

			result << model.GetBodyName(model.fixed_body_discriminator + fbody_index) << " [fixed]" << endl;
		}
	}


	return result.str();
}